

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O1

char * password_hash(char *password,char *algo,char *salt,int cost)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ssize_t sVar5;
  ushort **ppuVar6;
  time_t tVar7;
  size_t sVar8;
  char *__s;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  char format [10];
  char local_40 [16];
  
  if (password == (char *)0x0) {
    if (msgno < 0) {
      return (char *)0x0;
    }
    password_hash_cold_9();
    return (char *)0x0;
  }
  if (cost - 0x20U < 0xffffffe4) {
    if (msgno < 0) {
      return (char *)0x0;
    }
    fprintf(_stderr,"password_hash: invalid bcrypt cost parameter specified: %d\n",(ulong)(uint)cost
           );
    return (char *)0x0;
  }
  if (salt != (char *)0x0) {
    sVar3 = strlen(salt);
    pcVar4 = (char *)malloc(sVar3 + 1);
    if (pcVar4 == (char *)0x0) {
      if (msgno < 1) {
        return (char *)0x0;
      }
      password_hash_cold_2();
      return (char *)0x0;
    }
    memcpy(pcVar4,salt,sVar3);
    pcVar4[sVar3] = '\0';
    if (sVar3 < 0x16) {
      free(pcVar4);
      if (msgno < 1) {
        return (char *)0x0;
      }
      fprintf(_stderr,"password_hash: provided salt is too short: %ld expecting %ld\n",sVar3,0x16);
      return (char *)0x0;
    }
    ppuVar6 = __ctype_b_loc();
    sVar8 = 1;
    do {
      bVar12 = ((*ppuVar6)[pcVar4[sVar8 - 1]] & 8) == 0;
      bVar13 = (pcVar4[sVar8 - 1] & 0xfeU) != 0x2e;
      if (bVar13 && bVar12) break;
      bVar14 = sVar3 != sVar8;
      sVar8 = sVar8 + 1;
    } while (bVar14);
    if (bVar13 && bVar12) {
      uVar2 = to_base64(pcVar4,sVar3,sVar3);
      if ((int)uVar2 < 0) {
        free(pcVar4);
        if (0 < msgno) {
          password_hash_cold_1();
        }
      }
      else {
        pcVar4[uVar2] = '\0';
        sVar3 = strlen(pcVar4);
      }
      if ((int)uVar2 < 0) {
        return (char *)0x0;
      }
    }
    goto LAB_001018c8;
  }
  pcVar4 = (char *)malloc(0x17);
  if (pcVar4 == (char *)0x0) {
    if (-1 < msgno) {
      password_hash_cold_3();
    }
LAB_0010186c:
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\0';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    pcVar4[0xf] = '\0';
    pcVar4[0x10] = '\0';
    pcVar4[0x11] = '\0';
    pcVar4[0x12] = '\0';
    pcVar4[0x13] = '\0';
    pcVar4[0x14] = '\0';
    pcVar4[0x15] = '\0';
    pcVar4[0x16] = '\0';
    iVar1 = open("/dev/urandom",0);
    if (iVar1 < 0) {
LAB_00101807:
      lVar11 = 0;
      tVar7 = time((time_t *)0x0);
      srand((uint)tVar7);
      do {
        iVar1 = rand();
        pcVar4[lVar11] = pcVar4[lVar11] ^ (byte)(int)(((double)iVar1 * 255.0) / 2147483647.0);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x11);
    }
    else {
      sVar5 = read(iVar1,pcVar4,0x11);
      if ((int)sVar5 < 0) {
        close(iVar1);
        goto LAB_00101807;
      }
      uVar10 = 0;
      do {
        uVar10 = ((uint)sVar5 & 0x7fffffff) + uVar10;
        if (0x10 < uVar10) {
          close(iVar1);
          goto LAB_00101845;
        }
        sVar5 = read(iVar1,pcVar4 + uVar10,0x11 - uVar10);
      } while (-1 < (int)sVar5);
      close(iVar1);
      if (uVar10 < 0x11) goto LAB_00101807;
    }
LAB_00101845:
    uVar2 = to_base64(pcVar4,0x11,0x16);
    if ((int)uVar2 < 0) {
      free(pcVar4);
      goto LAB_0010186c;
    }
    pcVar4[uVar2] = '\0';
  }
  if (pcVar4 == (char *)0x0) {
    if (msgno < 1) {
      return (char *)0x0;
    }
    password_hash_cold_8();
    return (char *)0x0;
  }
  sVar3 = strlen(pcVar4);
LAB_001018c8:
  if (0 < msgno) {
    fprintf(_stderr,
            "password_hash: parameters\n  password  => %s\n  algorithm => %s\n  salt      => %s\n  cost      => %d\n"
            ,password,algo,pcVar4,(ulong)(uint)cost);
  }
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  sprintf(local_40,"$2y$%02d$",(ulong)(uint)cost);
  sVar8 = strlen(local_40);
  __s = (char *)malloc(sVar8 + sVar3 + 1);
  if (__s == (char *)0x0) {
    if (0 < msgno) {
      password_hash_cold_7();
    }
    free(pcVar4);
  }
  else {
    sprintf(__s,"%s%s",local_40,pcVar4);
    __s[sVar8 + sVar3] = '\0';
    free(pcVar4);
    if (1 < msgno) {
      fprintf(_stderr,"password_hash: hash => %s\n",__s);
    }
    pcVar4 = (char *)malloc(0x3d);
    if (pcVar4 == (char *)0x0) {
      free(__s);
      if (0 < msgno) {
        password_hash_cold_6();
      }
    }
    else {
      pcVar4[0x2d] = '\0';
      pcVar4[0x2e] = '\0';
      pcVar4[0x2f] = '\0';
      pcVar4[0x30] = '\0';
      pcVar4[0x31] = '\0';
      pcVar4[0x32] = '\0';
      pcVar4[0x33] = '\0';
      pcVar4[0x34] = '\0';
      pcVar4[0x35] = '\0';
      pcVar4[0x36] = '\0';
      pcVar4[0x37] = '\0';
      pcVar4[0x38] = '\0';
      pcVar4[0x39] = '\0';
      pcVar4[0x3a] = '\0';
      pcVar4[0x3b] = '\0';
      pcVar4[0x3c] = '\0';
      pcVar4[0x20] = '\0';
      pcVar4[0x21] = '\0';
      pcVar4[0x22] = '\0';
      pcVar4[0x23] = '\0';
      pcVar4[0x24] = '\0';
      pcVar4[0x25] = '\0';
      pcVar4[0x26] = '\0';
      pcVar4[0x27] = '\0';
      pcVar4[0x28] = '\0';
      pcVar4[0x29] = '\0';
      pcVar4[0x2a] = '\0';
      pcVar4[0x2b] = '\0';
      pcVar4[0x2c] = '\0';
      pcVar4[0x2d] = '\0';
      pcVar4[0x2e] = '\0';
      pcVar4[0x2f] = '\0';
      pcVar4[0x10] = '\0';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pcVar4[0x14] = '\0';
      pcVar4[0x15] = '\0';
      pcVar4[0x16] = '\0';
      pcVar4[0x17] = '\0';
      pcVar4[0x18] = '\0';
      pcVar4[0x19] = '\0';
      pcVar4[0x1a] = '\0';
      pcVar4[0x1b] = '\0';
      pcVar4[0x1c] = '\0';
      pcVar4[0x1d] = '\0';
      pcVar4[0x1e] = '\0';
      pcVar4[0x1f] = '\0';
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\0';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      pcVar9 = _crypt_blowfish_rn(password,__s,pcVar4,0x3d);
      free(__s);
      if (pcVar9 == (char *)0x0) {
        free(pcVar4);
        if (0 < msgno) {
          password_hash_cold_5();
        }
      }
      else {
        sVar3 = strlen(pcVar4);
        if (0xd < sVar3) {
          return pcVar4;
        }
        free(pcVar4);
        if (0 < msgno) {
          password_hash_cold_4();
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *
password_hash(const char *password, const char *algo,
              const char *salt, const int cost)
{
    char *gensalt = NULL, *hash = NULL, *output = NULL;
    char format[FORMAT_LEN];
    size_t output_len = BLOWFISH_LEN + 1;
    size_t salt_required_len = BCRYPT_BLOWFISH_SALT_REQUIRED_LEN;
    size_t format_len, salt_len;

    if (!password) {
        msg_error(hash, "missing password\n");
        return NULL;
    }

    if (cost < 4 || cost > 31) {
        msg_error(hash, "invalid bcrypt cost parameter specified: %d\n", cost);
        return NULL;
    }

    if (salt) {
        salt_len = strlen(salt);
        gensalt = (char *)malloc(salt_len + 1);
        if (!gensalt) {
            msg_verbose(hash, "memory allocate\n");
            return NULL;
        }
        memcpy(gensalt, salt, salt_len);
        gensalt[salt_len] = 0;

        if (salt_len < salt_required_len) {
            free(gensalt);
            msg_verbose(hash, "provided salt is too short: %ld expecting %ld\n",
                        salt_len, salt_required_len);
            return NULL;
        } else if (is_alphabet(gensalt, salt_len) < 0) {
            int len = to_base64(gensalt, salt_len, salt_len);
            if (len < 0) {
                free(gensalt);
                msg_verbose(hash, "provided salt is not alphabet\n");
                return NULL;
            }
            gensalt[len] = 0;
            salt_len = strlen(gensalt);
        }
    } else {
        gensalt = make_salt(salt_required_len);
        if (!gensalt) {
            msg_verbose(hash, "generated salt\n");
            return NULL;
        }
        salt_len = strlen(gensalt);
    }

    msg_verbose(hash,"parameters\n"
                "  password  => %s\n"
                "  algorithm => %s\n"
                "  salt      => %s\n"
                "  cost      => %d\n",
                password, algo, gensalt, cost);

    memset(format, 0, sizeof(format));
    sprintf(format, "$2y$%02d$", cost);
    format_len = strlen(format);

    hash = malloc(format_len + salt_len + 1);
    if (!hash) {
        msg_verbose(hash, "memory allocate\n");
        free(gensalt);
        return NULL;
    }

    sprintf(hash, "%s%s", format, gensalt);
    hash[format_len + salt_len] = 0;

    free(gensalt);

    msg_verbose_ex(hash, 2, "hash => %s\n", hash);

    output = malloc(output_len);
    if (!output) {
        free(hash);
        msg_verbose(hash, "memory allocate\n");
        return NULL;
    }

    memset(output, 0, output_len);

    if (_crypt_blowfish_rn(password, hash, output, output_len) == NULL) {
        free(hash);
        free(output);
        msg_verbose(hash, "blowfish run.\n");
        return NULL;
    }

    free(hash);

    if (strlen(output) <= 13) {
        free(output);
        msg_verbose(hash, "hash length.\n");
        return NULL;
    }

    return output;
}